

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O1

Option<Kernel::RationalConstantType> *
Kernel::parseExponentInteger
          (Option<Kernel::RationalConstantType> *__return_storage_ptr__,string *number,
          char *exponentChars)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  mp_ptr __mp_ptr_swap__tmp;
  long lVar5;
  int exp;
  Option<Kernel::RationalConstantType> base;
  int local_d4;
  undefined1 local_d0 [32];
  IntegerConstantType local_b0;
  RationalConstantType local_a0;
  RationalConstantType local_80;
  IntegerConstantType local_60;
  undefined1 local_50 [40];
  
  strlen(exponentChars);
  lVar5 = std::__cxx11::string::find_first_of((char *)number,(ulong)exponentChars,0);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)local_d0,(ulong)number);
    parseRat((Option<Kernel::RationalConstantType> *)local_50,(string *)local_d0);
    pcVar1 = local_d0 + 0x10;
    if ((char *)local_d0._0_8_ != pcVar1) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    local_d4 = 0;
    std::__cxx11::string::substr((ulong)local_d0,(ulong)number);
    bVar4 = ::Lib::Int::stringToInt((char *)local_d0._0_8_,&local_d4);
    bVar3 = local_50[0];
    if (bVar4) {
      if ((char *)local_d0._0_8_ != pcVar1) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      iVar2 = local_d4;
      if (bVar3 != false) {
        if (local_d4 < 0) {
          IntegerConstantType::IntegerConstantType(&local_b0,10);
          IntegerConstantType::operator^(&local_60,(unsigned_long)&local_b0);
          RationalConstantType::RationalConstantType(&local_a0,&local_60);
          RationalConstantType::operator/
                    ((RationalConstantType *)local_d0,(RationalConstantType *)(local_50 + 8),
                     &local_a0);
        }
        else {
          IntegerConstantType::IntegerConstantType
                    (&local_80._num,(IntegerConstantType *)(local_50 + 8));
          IntegerConstantType::IntegerConstantType
                    (&local_80._den,(IntegerConstantType *)(local_50 + 0x18));
          IntegerConstantType::IntegerConstantType(&local_b0,10);
          IntegerConstantType::operator^(&local_a0._num,(unsigned_long)&local_b0);
          operator*((RationalConstantType *)local_d0,&local_80,&local_a0._num);
        }
        (__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._isSome = true;
        *(undefined8 *)
         &(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem.
                 _elem + 8) = local_d0._8_8_;
        *(undefined8 *)
         &(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem =
             local_d0._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem.
                 _elem + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem.
                 _elem + 0x18) = local_d0._24_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem.
                 _elem + 0x10) = local_d0._16_8_;
        local_d0._24_8_ = &mpz_init::dummy_limb;
        local_d0._16_8_ = 0;
        local_d0._8_8_ = &mpz_init::dummy_limb;
        local_d0._0_8_ = (pointer)0x0;
        if (iVar2 < 0) {
          if ((long)local_a0._den._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_a0._den._val[0]._mp_d,(long)local_a0._den._val[0]._mp_alloc << 3)
            ;
          }
          if ((long)local_a0._num._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_a0._num._val[0]._mp_d,(long)local_a0._num._val[0]._mp_alloc << 3)
            ;
          }
          if ((long)local_60._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_60._val[0]._mp_d,(long)local_60._val[0]._mp_alloc << 3);
          }
          if ((long)local_b0._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_b0._val[0]._mp_d,(long)local_b0._val[0]._mp_alloc << 3);
          }
        }
        else {
          if ((long)local_a0._num._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_a0._num._val[0]._mp_d,(long)local_a0._num._val[0]._mp_alloc << 3)
            ;
          }
          if ((long)local_b0._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_b0._val[0]._mp_d,(long)local_b0._val[0]._mp_alloc << 3);
          }
          if ((long)local_80._den._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_80._den._val[0]._mp_d,(long)local_80._den._val[0]._mp_alloc << 3)
            ;
          }
          if ((long)local_80._num._val[0]._mp_alloc != 0) {
            (*gmp_free_func)(local_80._num._val[0]._mp_d,(long)local_80._num._val[0]._mp_alloc << 3)
            ;
          }
        }
        if (local_50[0] != true) {
          return __return_storage_ptr__;
        }
        if ((long)(int)local_50._24_4_ != 0) {
          (*gmp_free_func)((void *)local_50._32_8_,(long)(int)local_50._24_4_ << 3);
        }
        if ((long)(int)local_50._8_4_ == 0) {
          return __return_storage_ptr__;
        }
        (*gmp_free_func)((void *)local_50._16_8_,(long)(int)local_50._8_4_ << 3);
        return __return_storage_ptr__;
      }
    }
    else if ((char *)local_d0._0_8_ != pcVar1) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if (local_50[0] == true) {
      if ((long)(int)local_50._24_4_ != 0) {
        (*gmp_free_func)((void *)local_50._32_8_,(long)(int)local_50._24_4_ << 3);
      }
      if ((long)(int)local_50._8_4_ != 0) {
        (*gmp_free_func)((void *)local_50._16_8_,(long)(int)local_50._8_4_ << 3);
      }
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem + 8)
       = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem +
   0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType> = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem +
   0x18) = 0;
  return __return_storage_ptr__;
}

Assistant:

Option<RationalConstantType> parseExponentInteger(std::string const& number, const char* exponentChars) {
  auto i = number.find_first_of(exponentChars);
  if (i != std::string::npos) {
    auto base = parseRat(number.substr(0, i));
    int exp = 0;
    if (Int::stringToInt(number.substr(i + 1).c_str(), exp) && base.isSome()) {
      return some(
          exp >= 0 ? (*base) * (IntegerConstantType(10) ^ (unsigned long)exp)
                   : (*base) / RationalConstantType((IntegerConstantType(10) ^ (unsigned long)abs(exp))));
    }
  }
  return {};
}